

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O3

error_info *
toml::make_error_info<>
          (error_info *__return_storage_ptr__,string *title,source_location *loc,string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  error_info ei;
  string local_1b8;
  string local_198;
  char *local_178;
  size_type local_170;
  char local_168;
  undefined7 uStack_167;
  undefined8 uStack_160;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  char *local_140;
  size_type local_138;
  char local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  string local_120;
  error_info local_100;
  source_location local_a8;
  
  local_198._M_dataplus._M_p = (title->_M_dataplus)._M_p;
  paVar1 = &title->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p == paVar1) {
    local_198.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_198.field_2._8_8_ = *(undefined8 *)((long)&title->field_2 + 8);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_198._M_string_length = title->_M_string_length;
  (title->_M_dataplus)._M_p = (pointer)paVar1;
  title->_M_string_length = 0;
  (title->field_2)._M_local_buf[0] = '\0';
  local_a8.is_ok_ = loc->is_ok_;
  local_a8._1_7_ = *(undefined7 *)&loc->field_0x1;
  local_a8.first_line_ = loc->first_line_;
  local_a8.first_column_._0_4_ = (undefined4)loc->first_column_;
  local_a8.first_column_._4_4_ = *(undefined4 *)((long)&loc->first_column_ + 4);
  local_a8.first_offset_._0_4_ = (undefined4)loc->first_offset_;
  local_a8.first_offset_._4_4_ = *(undefined4 *)((long)&loc->first_offset_ + 4);
  local_a8.last_line_._0_4_ = (undefined4)loc->last_line_;
  local_a8.last_line_._4_4_ = *(undefined4 *)((long)&loc->last_line_ + 4);
  local_a8.last_column_._0_4_ = (undefined4)loc->last_column_;
  local_a8.last_column_._4_4_ = *(undefined4 *)((long)&loc->last_column_ + 4);
  local_a8.last_offset_._0_4_ = (undefined4)loc->last_offset_;
  local_a8.last_offset_._4_4_ = *(undefined4 *)((long)&loc->last_offset_ + 4);
  local_a8.length_._0_4_ = (undefined4)loc->length_;
  local_a8.length_._4_4_ = *(undefined4 *)((long)&loc->length_ + 4);
  local_a8.file_name_._M_dataplus._M_p = (pointer)&local_a8.file_name_.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(loc->file_name_)._M_dataplus._M_p;
  paVar1 = &(loc->file_name_).field_2;
  if (paVar2 == paVar1) {
    local_a8.file_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8.file_name_.field_2._8_8_ = *(undefined8 *)((long)&(loc->file_name_).field_2 + 8);
  }
  else {
    local_a8.file_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a8.file_name_._M_dataplus._M_p = (pointer)paVar2;
  }
  local_a8.file_name_._M_string_length = (loc->file_name_)._M_string_length;
  (loc->file_name_)._M_dataplus._M_p = (pointer)paVar1;
  (loc->file_name_)._M_string_length = 0;
  (loc->file_name_).field_2._M_local_buf[0] = '\0';
  local_a8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (loc->line_str_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (loc->line_str_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a8.line_str_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (loc->line_str_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (loc->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (loc->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (loc->line_str_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8._M_dataplus._M_p = (msg->_M_dataplus)._M_p;
  paVar1 = &msg->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == paVar1) {
    local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1b8.field_2._8_4_ = *(undefined4 *)((long)&msg->field_2 + 8);
    local_1b8.field_2._12_4_ = *(undefined4 *)((long)&msg->field_2 + 0xc);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_1b8._M_string_length = msg->_M_string_length;
  (msg->_M_dataplus)._M_p = (pointer)paVar1;
  msg->_M_string_length = 0;
  (msg->field_2)._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  error_info::error_info(&local_100,&local_198,&local_a8,&local_1b8,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_178 = &local_168;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_100.title_._M_dataplus._M_p,
             local_100.title_._M_dataplus._M_p + local_100.title_._M_string_length);
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_158,&local_100.locations_);
  local_140 = &local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_100.suffix_._M_dataplus._M_p,
             local_100.suffix_._M_dataplus._M_p + local_100.suffix_._M_string_length);
  paVar1 = &(__return_storage_ptr__->title_).field_2;
  (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_178 == &local_168) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_167,local_168);
    *(undefined8 *)((long)&(__return_storage_ptr__->title_).field_2 + 8) = uStack_160;
  }
  else {
    (__return_storage_ptr__->title_)._M_dataplus._M_p = local_178;
    (__return_storage_ptr__->title_).field_2._M_allocated_capacity = CONCAT71(uStack_167,local_168);
  }
  (__return_storage_ptr__->title_)._M_string_length = local_170;
  local_170 = 0;
  local_168 = '\0';
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_158.
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_158.
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_158.
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &(__return_storage_ptr__->suffix_).field_2;
  (__return_storage_ptr__->suffix_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_140 == &local_130) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_12f,local_130);
    *(undefined8 *)((long)&(__return_storage_ptr__->suffix_).field_2 + 8) = uStack_128;
  }
  else {
    (__return_storage_ptr__->suffix_)._M_dataplus._M_p = local_140;
    (__return_storage_ptr__->suffix_).field_2._M_allocated_capacity = CONCAT71(uStack_12f,local_130)
    ;
  }
  (__return_storage_ptr__->suffix_)._M_string_length = local_138;
  local_138 = 0;
  local_130 = '\0';
  local_178 = &local_168;
  local_140 = &local_130;
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_158);
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.suffix_._M_dataplus._M_p != &local_100.suffix_.field_2) {
    operator_delete(local_100.suffix_._M_dataplus._M_p,
                    local_100.suffix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_100.locations_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.title_._M_dataplus._M_p != &local_100.title_.field_2) {
    operator_delete(local_100.title_._M_dataplus._M_p,
                    local_100.title_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}